

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

void * rw::ps2::destroyNativeData(void *object,int32 param_2,int32 param_3)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  
  piVar1 = *(int **)((long)object + 0x98);
  if ((piVar1 != (int *)0x0) && (*piVar1 == 4)) {
    if (piVar1[1] != 0) {
      lVar3 = 8;
      uVar2 = 0;
      do {
        (*DAT_00149da0)(*(undefined8 *)(*(long *)(piVar1 + 2) + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x20;
      } while (uVar2 < (uint)piVar1[1]);
    }
    (*DAT_00149da0)(*(undefined8 *)(piVar1 + 2));
    (*DAT_00149da0)(piVar1);
    *(undefined8 *)((long)object + 0x98) = 0;
  }
  return object;
}

Assistant:

void*
destroyNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_PS2)
		return object;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	for(uint32 i = 0; i < header->numMeshes; i++)
		rwFree(header->instanceMeshes[i].dataRaw);
	rwFree(header->instanceMeshes);
	rwFree(header);
	geometry->instData = nil;
	return object;
}